

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O2

bool ContainsData(ScopeData *scope,bool checkImported)

{
  TypeBase *pTVar1;
  bool bVar2;
  uint uVar3;
  TypeBase **ppTVar4;
  FunctionData **ppFVar5;
  VariableData **ppVVar6;
  AliasData **ppAVar7;
  ScopeData **ppSVar8;
  undefined7 in_register_00000031;
  uint i;
  uint uVar9;
  bool bVar10;
  
  uVar9 = 0;
  do {
    if ((scope->types).count <= uVar9) {
      uVar9 = 0;
      do {
        if ((scope->functions).count <= uVar9) {
          if ((scope->ownerFunction == (FunctionData *)0x0) ||
             ((scope->ownerFunction->importModule == (ModuleData *)0x0) != checkImported)) {
            uVar9 = 0;
            while (uVar9 < (scope->variables).count) {
              ppVVar6 = SmallArray<VariableData_*,_4U>::operator[](&scope->variables,uVar9);
              uVar9 = uVar9 + 1;
              if (((*ppVVar6)->importModule == (ModuleData *)0x0) != checkImported) {
                return true;
              }
            }
          }
          uVar9 = 0;
          do {
            if ((scope->aliases).count <= uVar9) {
              uVar9 = 0;
              do {
                bVar10 = uVar9 < (scope->scopes).count;
                if (!bVar10) {
                  return bVar10;
                }
                ppSVar8 = SmallArray<ScopeData_*,_2U>::operator[](&scope->scopes,uVar9);
                bVar2 = ContainsData(*ppSVar8,checkImported);
                uVar9 = uVar9 + 1;
              } while (!bVar2);
              return bVar10;
            }
            ppAVar7 = SmallArray<AliasData_*,_2U>::operator[](&scope->aliases,uVar9);
            uVar9 = uVar9 + 1;
          } while (((*ppAVar7)->importModule == (ModuleData *)0x0) == checkImported);
          return true;
        }
        ppFVar5 = SmallArray<FunctionData_*,_2U>::operator[](&scope->functions,uVar9);
        uVar9 = uVar9 + 1;
      } while (((*ppFVar5)->importModule == (ModuleData *)0x0) == checkImported);
      return true;
    }
    ppTVar4 = SmallArray<TypeBase_*,_2U>::operator[](&scope->types,uVar9);
    pTVar1 = *ppTVar4;
    uVar3 = 0;
    if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x18)) {
      uVar3 = (uint)(pTVar1->importModule != (ModuleData *)0x0);
    }
    uVar9 = uVar9 + 1;
  } while (uVar3 != (uint)CONCAT71(in_register_00000031,checkImported));
  return true;
}

Assistant:

bool ContainsData(ScopeData *scope, bool checkImported)
{
	for(unsigned i = 0; i < scope->types.size(); i++)
	{
		TypeBase *data = scope->types[i];

		bool imported = getType<TypeClass>(data) && getType<TypeClass>(data)->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->functions.size(); i++)
	{
		bool imported = scope->functions[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	bool ownerFunctionImported = scope->ownerFunction && scope->ownerFunction->importModule != NULL;

	if(!scope->ownerFunction || checkImported == ownerFunctionImported)
	{
		for(unsigned i = 0; i < scope->variables.size(); i++)
		{
			bool imported = scope->variables[i]->importModule != NULL;

			if(checkImported == imported)
				return true;
		}
	}

	for(unsigned i = 0; i < scope->aliases.size(); i++)
	{
		bool imported = scope->aliases[i]->importModule != NULL;

		if(checkImported == imported)
			return true;
	}

	for(unsigned i = 0; i < scope->scopes.size(); i++)
	{
		if(ContainsData(scope->scopes[i], checkImported))
			return true;
	}

	return false;
}